

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::InnerProduct3D_1D_1D::forward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  Tensor *pTVar4;
  Assign assign;
  DefaultDevice local_c1;
  type local_c0;
  type local_38;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_28;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  if ((pTVar2->d).nd != 3) {
    __assert_fail("d.ndims() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                  ,0xc0,"const Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t() const");
  }
  pTVar3 = ppTVar1[1];
  if (((pTVar3->d).nd == 1) && (pTVar4 = ppTVar1[2], (pTVar4->d).nd == 1)) {
    local_c0.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_data = pTVar2->v;
    local_c0.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         (long)(int)(pTVar2->d).d[0];
    local_c0.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         (long)(int)(pTVar2->d).d[1];
    local_c0.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         (long)(int)(pTVar2->d).d[2];
    local_c0.m_lhs_xpr.m_lhs_xpr.m_rhs_xpr.m_data = pTVar3->v;
    local_c0.m_lhs_xpr.m_lhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(pTVar3->d).d[0];
    local_c0.m_lhs_xpr.m_rhs_xpr.m_data = pTVar4->v;
    local_c0.m_lhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(pTVar4->d).d[0];
    if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 == 0x18) {
      local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].first = 2;
      local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].second = 0;
      local_c0.m_lhs_xpr.m_indices._M_elems[0].first = 1;
      local_c0.m_lhs_xpr.m_indices._M_elems[0].second = 0;
      if ((fx->d).nd != 1) {
LAB_001a2018:
        local_c0.m_lhs_xpr.m_indices._M_elems[0].second = 0;
        local_c0.m_lhs_xpr.m_indices._M_elems[0].first = 1;
        local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].second = 0;
        local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].first = 2;
        __assert_fail("d.ndims() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                      ,0xac,"Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t()");
      }
      local_38.m_data = fx->v;
      local_38.m_dimensions.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(long)(int)(fx->d).d[0];
      local_28.m_lhs_xpr = &local_38;
      local_28.m_rhs_xpr = &local_c0;
      Eigen::internal::
      TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
      ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>
             *)&local_28,&local_c1);
    }
    else {
      pTVar2 = ppTVar1[3];
      if ((pTVar2->d).nd != 1) goto LAB_001a1fda;
      local_c0.m_rhs_xpr.m_data = pTVar2->v;
      local_c0.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(long)(int)(pTVar2->d).d[0];
      local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].first = 2;
      local_c0.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].second = 0;
      local_c0.m_lhs_xpr.m_indices._M_elems[0].first = 1;
      local_c0.m_lhs_xpr.m_indices._M_elems[0].second = 0;
      if ((fx->d).nd != 1) goto LAB_001a2018;
      local_38.m_data = fx->v;
      local_38.m_dimensions.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(long)(int)(fx->d).d[0];
      local_28.m_lhs_xpr = &local_38;
      local_28.m_rhs_xpr = &local_c0;
      Eigen::internal::
      TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
      ::run(&local_28,&local_c1);
    }
    return;
  }
LAB_001a1fda:
  __assert_fail("d.ndims() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/tensor.h"
                ,0xb0,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t() const");
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}